

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_long_&,_const_int_&> * __thiscall
Catch::ExprLhs<long_const&>::operator==
          (BinaryExpr<const_long_&,_const_int_&> *__return_storage_ptr__,ExprLhs<long_const&> *this,
          int *rhs)

{
  long *lhs;
  bool comparisonResult;
  StringRef local_30;
  int *local_20;
  int *rhs_local;
  ExprLhs<const_long_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (int *)this;
  this_local = (ExprLhs<const_long_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<long,int>(*(long **)this,rhs);
  lhs = *(long **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_long_&,_const_int_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }